

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_connect_common(Curl_easy *data,connectdata *conn,int sockindex,_Bool nonblocking,
                            _Bool *done)

{
  ssl_connection_state sVar1;
  ssl_backend_data *psVar2;
  ssl_backend_data *psVar3;
  ulong uVar4;
  proxy_info *ppVar5;
  ssl_config_data *psVar6;
  ssl_config_data *psVar7;
  ssl_config_data *psVar8;
  char cVar9;
  byte bVar10;
  byte bVar11;
  _Bool _Var12;
  int iVar13;
  CURLcode CVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  curl_proxytype cVar19;
  uint uVar20;
  CURLcode CVar21;
  timediff_t tVar22;
  char *pcVar23;
  SSL_CIPHER *c;
  char *pcVar24;
  uint *puVar25;
  BIO_METHOD *pBVar26;
  BIO *pBVar27;
  stack_st_X509 *psVar28;
  BIO *a;
  X509 *pXVar29;
  X509_NAME *pXVar30;
  size_t sVar31;
  undefined8 uVar32;
  ASN1_INTEGER *pAVar33;
  X509_PUBKEY *pXVar34;
  X509_EXTENSION *ex;
  BIO *out;
  ASN1_OBJECT *a_00;
  ASN1_OCTET_STRING *v;
  ASN1_TIME *pAVar35;
  EVP_PKEY *pEVar36;
  ulong uVar37;
  char *pcVar38;
  SSL_METHOD *meth;
  SSL_CTX *pSVar39;
  X509 *pXVar40;
  GENERAL_NAMES *a_01;
  X509 *__s;
  undefined8 extraout_RAX;
  X509_NAME_ENTRY *ne;
  ASN1_STRING *x;
  void *__src;
  int *piVar41;
  char **ppcVar42;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  stack_st_X509_INFO *psVar43;
  undefined8 *puVar44;
  size_t sVar45;
  curl_blob *pcVar46;
  OCSP_RESPONSE *resp;
  uchar *pubkey;
  OCSP_BASICRESP *bs;
  X509_STORE *pXVar47;
  X509 *pXVar48;
  EVP_MD *dgst;
  OCSP_CERTID *id;
  PKCS12 *p12;
  SSL *pSVar49;
  UI_METHOD *method;
  UI_METHOD *pUVar50;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  evp_pkey_st *peVar51;
  rsa_st *r;
  undefined7 in_register_00000009;
  long lVar52;
  long lVar53;
  curl_blob **ppcVar54;
  curl_socket_t writefd;
  long lVar55;
  size_t size;
  size_t size_00;
  size_t size_01;
  char **ppcVar56;
  size_t size_02;
  size_t size_03;
  size_t size_04;
  size_t size_05;
  size_t size_06;
  size_t size_07;
  size_t size_08;
  size_t size_09;
  size_t size_10;
  size_t size_11;
  size_t size_12;
  long lVar57;
  curl_socket_t readfd0;
  long lVar58;
  ENGINE *e;
  undefined7 uVar59;
  ssl_connect_data *psVar60;
  ssl_connect_state sVar61;
  bool bVar62;
  curl_blob *local_ab0;
  X509 *local_aa8;
  X509 *x509;
  ssl_connect_data *local_a90;
  stack_st_X509 *local_a88;
  X509 *local_a80;
  SSL_CTX *local_a78;
  X509 *local_a70;
  ASN1_BIT_STRING *psig;
  void *ssl_sessionid;
  X509 *local_a58;
  ASN1_OBJECT *pubkeyoid;
  ulong local_a48;
  in6_addr addr;
  long local_a20;
  curl_blob *local_a18;
  int crl_reason;
  char *local_a08;
  undefined8 local_a00;
  long local_9f8;
  int local_9f0;
  curl_socket_t local_9ec;
  char *local_9e8;
  _Bool *local_9e0;
  long local_9d8;
  X509 *local_9d0;
  curl_blob *local_9c8;
  char *local_9c0;
  anon_struct_16_2_531ec2c5 params;
  char error_buffer [256];
  char error_buffer_1 [256];
  
  local_a70 = (X509 *)CONCAT44(local_a70._4_4_,(int)CONCAT71(in_register_00000009,nonblocking));
  lVar52 = (long)sockindex;
  if (conn->ssl[lVar52].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  local_a90 = conn->ssl + lVar52;
  local_a58 = (X509 *)CONCAT44(local_a58._4_4_,conn->sock[lVar52]);
  sVar61 = conn->ssl[lVar52].connecting_state;
  local_9e0 = done;
  local_9d8 = lVar52;
  if (sVar61 == ssl_connect_1) {
    tVar22 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar22 < 0) {
LAB_0014d949:
      Curl_failf(data,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    local_9ec = conn->sock[local_9d8];
    ssl_sessionid = (void *)0x0;
    uVar59 = (undefined7)((ulong)done >> 8);
    if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
      sVar1 = conn->proxy_ssl[conn->sock[1] != -1].state;
      if (sVar1 == ssl_connection_complete) {
        local_a08 = (conn->host).name;
        lVar53 = 0x298;
        lVar55 = 0x5c0;
        lVar57 = 0x5f0;
        lVar58 = 0x2f0;
      }
      else {
        local_a08 = (conn->http_proxy).host.name;
        lVar53 = 0x308;
        lVar55 = 0x690;
        lVar57 = 0x6c0;
        lVar58 = 0x360;
      }
      uVar37 = *(ulong *)((conn->chunk).hexbuffer + lVar53 + -0x3d);
      local_aa8 = *(X509 **)((long)&data->magic + lVar55);
      local_ab0 = *(curl_blob **)((long)&data->magic + lVar57);
      pcVar46 = *(curl_blob **)((conn->chunk).hexbuffer + lVar58 + -0x3d);
      local_a18 = (curl_blob *)0x0;
      if (sVar1 == ssl_connection_complete) {
        local_a80 = (X509 *)(data->set).ssl.cert_type;
        lVar53 = 0x618;
        lVar55 = 0x300;
        lVar57 = 0x2a8;
        if (pcVar46 == (curl_blob *)0x0) {
          local_a00 = CONCAT71(uVar59,1);
          goto LAB_0014d9cb;
        }
      }
      else {
        local_a80 = (X509 *)(data->set).proxy_ssl.cert_type;
        lVar53 = 0x6e8;
        lVar55 = 0x370;
        lVar57 = 0x318;
        if (pcVar46 == (curl_blob *)0x0) {
          local_a00 = CONCAT71(uVar59,1);
          lVar58 = 800;
          goto LAB_0014e387;
        }
      }
      local_a00 = 0;
      local_a20 = 0;
      local_a18 = pcVar46;
    }
    else {
      local_a08 = (conn->host).name;
      uVar37 = (conn->ssl_config).version;
      local_a18 = (conn->ssl_config).ca_info_blob;
      local_aa8 = (X509 *)(data->set).ssl.primary.clientcert;
      local_ab0 = (data->set).ssl.primary.cert_blob;
      local_a80 = (X509 *)(data->set).ssl.cert_type;
      lVar53 = 0x618;
      lVar55 = 0x300;
      lVar57 = 0x2a8;
      local_a00 = CONCAT71(uVar59,local_a18 == (curl_blob *)0x0);
      if (local_a18 == (curl_blob *)0x0) {
LAB_0014d9cb:
        lVar57 = 0x2a8;
        lVar55 = 0x300;
        lVar53 = 0x618;
        lVar58 = 0x2b0;
LAB_0014e387:
        local_a20 = *(long *)((conn->chunk).hexbuffer + lVar58 + -0x3d);
      }
      else {
        local_a20 = 0;
      }
    }
    local_9f8 = *(long *)((conn->chunk).hexbuffer + lVar57 + -0x3d);
    local_a48 = CONCAT44(local_a48._4_4_,(uint)(byte)(conn->chunk).hexbuffer[lVar55 + -0x3d]);
    pcVar38 = *(char **)((long)&data->magic + lVar53);
    psVar2 = local_a90->backend;
    CVar14 = ossl_seed(data);
    local_a88 = (stack_st_X509 *)CONCAT44(local_a88._4_4_,CVar14);
    if (CVar14 != CURLE_OK) goto LAB_0014ee14;
    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
       (lVar53 = 0x6e0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar53 = 0x610;
    }
    *(undefined8 *)((long)&data->magic + lVar53) = 1;
    if (7 < uVar37) {
      Curl_failf(data,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
LAB_0014ee0d:
      uVar17 = 0x23;
      goto LAB_0014ee0f;
    }
    local_a88 = (stack_st_X509 *)CONCAT44(local_a88._4_4_,4);
    if ((0xf3UL >> (uVar37 & 0x3f) & 1) == 0) {
      if (uVar37 == 2) {
        pcVar38 = "No SSLv2 support";
      }
      else {
        pcVar38 = "No SSLv3 support";
      }
LAB_0014e5f1:
      Curl_failf(data,pcVar38);
      goto LAB_0014ee14;
    }
    meth = (SSL_METHOD *)TLS_client_method();
    if ((SSL_CTX *)psVar2->ctx != (SSL_CTX *)0x0) {
      SSL_CTX_free((SSL_CTX *)psVar2->ctx);
    }
    pSVar39 = SSL_CTX_new(meth);
    psVar2->ctx = (SSL_CTX *)pSVar39;
    if (pSVar39 == (SSL_CTX *)0x0) {
      uVar37 = ERR_peek_error();
      ossl_strerror(uVar37,error_buffer,size_00);
      Curl_failf(data,"SSL: couldn\'t create a context: %s",error_buffer);
LAB_0014e547:
      uVar17 = 0x1b;
    }
    else {
      SSL_CTX_ctrl(pSVar39,0x21,0x10,(void *)0x0);
      if (((data->set).fdebug != (curl_debug_callback)0x0) &&
         (((data->set).field_0x9a3 & 0x40) != 0)) {
        SSL_CTX_set_msg_callback((SSL_CTX *)psVar2->ctx,ossl_trace);
        SSL_CTX_ctrl((SSL_CTX *)psVar2->ctx,0x10,0,conn);
        (conn->ssl[0].backend)->logger = data;
      }
      uVar32 = 0x82024850;
      cVar19 = (conn->http_proxy).proxytype;
      if ((cVar19 == CURLPROXY_HTTPS) &&
         (iVar13 = conn->sock[1], conn->proxy_ssl[iVar13 != -1].state != ssl_connection_complete)) {
        if (((data->set).proxy_ssl.field_0xc8 & 4) == 0) {
LAB_0014e625:
          uVar32 = 0x82024050;
          goto LAB_0014e62c;
        }
        if ((uVar37 & 0xfffffffffffffffe) == 2) goto LAB_0014ee14;
        pSVar39 = (SSL_CTX *)psVar2->ctx;
LAB_0014ebd6:
        lVar53 = 0x308;
        if (conn->proxy_ssl[iVar13 != -1].state == ssl_connection_complete) {
          lVar53 = 0x298;
        }
      }
      else {
        if (((data->set).ssl.field_0xc8 & 4) == 0) goto LAB_0014e625;
LAB_0014e62c:
        if ((uVar37 & 0xfffffffffffffffe) == 2) goto LAB_0014ee14;
        pSVar39 = (SSL_CTX *)psVar2->ctx;
        lVar53 = 0x298;
        if (cVar19 == CURLPROXY_HTTPS) {
          iVar13 = conn->sock[1];
          goto LAB_0014ebd6;
        }
      }
      switch(*(undefined8 *)((conn->chunk).hexbuffer + lVar53 + -0x3d)) {
      case 0:
        goto switchD_0014ec14_caseD_0;
      case 1:
      case 4:
        lVar53 = 0x301;
        break;
      default:
        lVar53 = 0;
        break;
      case 5:
        lVar53 = 0x302;
        break;
      case 6:
        lVar53 = 0x303;
        break;
      case 7:
        lVar53 = 0x304;
      }
      lVar53 = SSL_CTX_ctrl(pSVar39,0x7b,lVar53,(void *)0x0);
      if (lVar53 == 0) goto LAB_0014ee0d;
      cVar19 = (conn->http_proxy).proxytype;
switchD_0014ec14_caseD_0:
      if ((cVar19 != CURLPROXY_HTTPS) ||
         (lVar53 = 0x310, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar53 = 0x2a0;
      }
      uVar37 = *(ulong *)((conn->chunk).hexbuffer + lVar53 + -0x3d);
      uVar4 = uVar37 << 0x30;
      uVar37 = uVar37 >> 0x10;
      lVar53 = (uVar4 | uVar37) + 0x2fd;
      if ((uVar4 | uVar37 & 0xfffffffffffffffc) != 4) {
        lVar53 = 0;
      }
      lVar53 = SSL_CTX_ctrl(pSVar39,0x7c,lVar53,(void *)0x0);
      local_a88 = (stack_st_X509 *)CONCAT44(local_a88._4_4_,0x23);
      if (lVar53 == 0) goto LAB_0014ee14;
      SSL_CTX_set_options(psVar2->ctx,uVar32);
      uVar17 = (uint)*(undefined8 *)&(conn->bits).field_0x4;
      if ((uVar17 >> 0x1b & 1) != 0) {
        SSL_CTX_set_next_proto_select_cb((SSL_CTX *)psVar2->ctx,select_next_proto_cb,data);
        uVar17 = (uint)*(undefined8 *)&(conn->bits).field_0x4;
      }
      if ((uVar17 >> 0x1c & 1) != 0) {
        builtin_strncpy(error_buffer_1,"\bhttp/1.1",9);
        Curl_infof(data,"ALPN, offering %s","http/1.1");
        iVar13 = SSL_CTX_set_alpn_protos(psVar2->ctx,error_buffer_1,9);
        if (iVar13 != 0) {
          pcVar38 = "Error setting ALPN";
          goto LAB_0014e5f1;
        }
      }
      if ((local_aa8 != (X509 *)0x0 || local_ab0 != (curl_blob *)0x0) || local_a80 != (X509 *)0x0) {
        if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
          psVar6 = &(data->set).ssl;
          psVar7 = &(data->set).ssl;
          psVar8 = &(data->set).ssl;
          bVar62 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
          if (!bVar62) {
            psVar8 = &(data->set).proxy_ssl;
            psVar6 = &(data->set).proxy_ssl;
            psVar7 = &(data->set).proxy_ssl;
          }
          ppcVar54 = &psVar7->key_blob;
          ppcVar42 = &psVar6->key;
          ppcVar56 = &psVar8->key_type;
          lVar53 = 0x730;
          if (bVar62) {
            lVar53 = 0x660;
          }
        }
        else {
          ppcVar42 = &(data->set).ssl.key;
          ppcVar54 = &(data->set).ssl.key_blob;
          ppcVar56 = &(data->set).ssl.key_type;
          lVar53 = 0x660;
        }
        local_a78 = (SSL_CTX *)psVar2->ctx;
        local_9c8 = *ppcVar54;
        local_9d0 = (X509 *)*ppcVar42;
        local_9e8 = *ppcVar56;
        pcVar23 = *(char **)((long)&data->magic + lVar53);
        iVar13 = do_file_type((char *)local_a80);
        pSVar39 = local_a78;
        if (((local_aa8 != (X509 *)0x0) || (local_ab0 != (curl_blob *)0x0)) || (iVar13 == 0x2a)) {
          if (pcVar23 != (char *)0x0) {
            SSL_CTX_set_default_passwd_cb_userdata(local_a78,pcVar23);
            SSL_CTX_set_default_passwd_cb(pSVar39,passwd_callback);
          }
          if (iVar13 == 0x2b) {
            psig = (ASN1_BIT_STRING *)0x0;
            if (local_ab0 == (curl_blob *)0x0) {
              pBVar26 = BIO_s_file();
              pBVar27 = BIO_new(pBVar26);
              if (pBVar27 == (BIO *)0x0) {
                uVar37 = ERR_get_error();
                ossl_strerror(uVar37,error_buffer_1,size_08);
                pcVar38 = "BIO_new return NULL, OpenSSL error %s";
                goto LAB_001509ce;
              }
              lVar53 = BIO_ctrl(pBVar27,0x6c,3,local_aa8);
              if (0 < (int)lVar53) goto LAB_001501d3;
              Curl_failf(data,"could not open PKCS12 file \'%s\'",local_aa8);
              BIO_free(pBVar27);
            }
            else {
              pBVar27 = BIO_new_mem_buf(local_ab0->data,(int)local_ab0->len);
              if (pBVar27 == (BIO *)0x0) {
                uVar37 = ERR_get_error();
                ossl_strerror(uVar37,error_buffer_1,size_04);
                pcVar38 = "BIO_new_mem_buf NULL, OpenSSL error %s";
                goto LAB_001509ce;
              }
LAB_001501d3:
              p12 = d2i_PKCS12_bio(pBVar27,(PKCS12 **)0x0);
              BIO_free(pBVar27);
              if (p12 == (PKCS12 *)0x0) {
                if (local_ab0 != (curl_blob *)0x0) {
                  local_aa8 = (X509 *)0x15eb81;
                }
                pcVar38 = "error reading PKCS12 file \'%s\'";
                goto LAB_001509d6;
              }
              PKCS12_PBE_add();
              iVar15 = PKCS12_parse(p12,pcVar23,(EVP_PKEY **)&params,(X509 **)&x509,
                                    (stack_st_X509 **)&psig);
              if (iVar15 == 0) {
                uVar37 = ERR_get_error();
                ossl_strerror(uVar37,error_buffer_1,size_10);
                Curl_failf(data,"could not parse PKCS12 file, check password, OpenSSL error %s",
                           error_buffer_1);
                PKCS12_free(p12);
                goto LAB_00150d2a;
              }
              PKCS12_free(p12);
              iVar15 = SSL_CTX_use_certificate(local_a78,(X509 *)x509);
              if (iVar15 == 1) {
                iVar15 = SSL_CTX_use_PrivateKey(local_a78,(EVP_PKEY *)params.cert_id);
                if (iVar15 != 1) {
                  pcVar38 = "unable to use private key from PKCS12 file \'%s\'";
                  goto LAB_00150cb6;
                }
                iVar15 = SSL_CTX_check_private_key(local_a78);
                if (iVar15 == 0) {
                  pcVar38 = 
                  "private key from PKCS12 file \'%s\' does not match certificate in same file";
                  goto LAB_00150cb6;
                }
                if (psig == (ASN1_BIT_STRING *)0x0) {
LAB_00150ce7:
                  EVP_PKEY_free((EVP_PKEY *)params.cert_id);
                  X509_free((X509 *)x509);
                  OPENSSL_sk_pop_free(psig,X509_free);
                  bVar62 = false;
                  goto LAB_00150906;
                }
                do {
                  iVar15 = OPENSSL_sk_num(psig);
                  if (iVar15 == 0) goto LAB_00150ce7;
                  pXVar29 = (X509 *)OPENSSL_sk_pop(psig);
                  iVar15 = SSL_CTX_add_client_CA(local_a78,pXVar29);
                  if (iVar15 == 0) {
                    X509_free(pXVar29);
                    pcVar38 = "cannot add certificate to client CA list";
                    goto LAB_00150d40;
                  }
                  lVar53 = SSL_CTX_ctrl(local_a78,0xe,0,pXVar29);
                } while (lVar53 != 0);
                X509_free(pXVar29);
                pcVar38 = "cannot add certificate to certificate chain";
LAB_00150d40:
                Curl_failf(data,pcVar38);
              }
              else {
                uVar37 = ERR_get_error();
                local_aa8 = (X509 *)error_buffer_1;
                ossl_strerror(uVar37,(char *)local_aa8,size_11);
                pcVar38 = "could not load PKCS12 client certificate, OpenSSL error %s";
LAB_00150cb6:
                Curl_failf(data,pcVar38,local_aa8);
              }
              EVP_PKEY_free((EVP_PKEY *)params.cert_id);
              X509_free((X509 *)x509);
              OPENSSL_sk_pop_free(psig,X509_free);
            }
          }
          else if (iVar13 == 2) {
            if (local_ab0 == (curl_blob *)0x0) {
              iVar15 = SSL_CTX_use_certificate_file(local_a78,(char *)local_aa8,2);
LAB_00150157:
              bVar62 = true;
              if (iVar15 == 1) goto LAB_00150906;
            }
            else {
              pBVar27 = BIO_new_mem_buf(local_ab0->data,(int)local_ab0->len);
              if (pBVar27 != (BIO *)0x0) {
                iVar15 = 0;
                pXVar29 = d2i_X509_bio(pBVar27,(X509 **)0x0);
                if (pXVar29 != (X509 *)0x0) {
                  iVar15 = SSL_CTX_use_certificate(local_a78,pXVar29);
                }
                X509_free(pXVar29);
                BIO_free(pBVar27);
                goto LAB_00150157;
              }
            }
            uVar37 = ERR_get_error();
            ossl_strerror(uVar37,error_buffer_1,size_05);
            pcVar38 = 
            "could not load ASN1 client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
            ;
LAB_001509ce:
            local_aa8 = (X509 *)error_buffer_1;
LAB_001509d6:
            Curl_failf(data,pcVar38,local_aa8);
          }
          else if (iVar13 == 0x2a) {
            e = (ENGINE *)(data->state).engine;
            if (e == (ENGINE *)0x0) {
              _Var12 = is_pkcs11_uri((char *)local_aa8);
              if ((_Var12) && (CVar14 = ossl_set_engine(data,"pkcs11"), CVar14 != CURLE_OK))
              goto LAB_00150d2a;
              e = (ENGINE *)(data->state).engine;
              if (e != (ENGINE *)0x0) goto LAB_0014fee0;
              pcVar38 = "crypto engine not set, can\'t load certificate";
              goto LAB_00150d23;
            }
LAB_0014fee0:
            params.cert_id = (char *)local_aa8;
            params.cert = (X509 *)0x0;
            iVar15 = ENGINE_ctrl(e,0xd,0,"LOAD_CERT_CTRL",(f *)0x0);
            if (iVar15 == 0) {
              pcVar38 = "ssl engine does not support loading certificates";
              goto LAB_00150d23;
            }
            iVar15 = ENGINE_ctrl_cmd((ENGINE *)(data->state).engine,"LOAD_CERT_CTRL",0,&params,
                                     (f *)0x0,1);
            if (iVar15 != 0) {
              if (params.cert == (X509 *)0x0) {
                pcVar38 = "ssl engine didn\'t initialized the certificate properly.";
                goto LAB_00150d23;
              }
              iVar15 = SSL_CTX_use_certificate(local_a78,(X509 *)params.cert);
              if (iVar15 != 1) {
                Curl_failf(data,"unable to set client certificate");
                X509_free((X509 *)params.cert);
                goto LAB_00150d2a;
              }
              X509_free((X509 *)params.cert);
              bVar62 = true;
              goto LAB_00150906;
            }
            uVar37 = ERR_get_error();
            pcVar38 = error_buffer_1;
            ossl_strerror(uVar37,pcVar38,size_07);
            pcVar23 = "ssl engine cannot load client cert with id \'%s\' [%s]";
LAB_00150c30:
            Curl_failf(data,pcVar23,local_aa8,pcVar38);
          }
          else {
            if (iVar13 != 1) {
              pcVar38 = "not supported file type \'%s\' for certificate";
              local_aa8 = local_a80;
              goto LAB_001509d6;
            }
            if (local_ab0 != (curl_blob *)0x0) {
              pBVar27 = BIO_new_mem_buf(local_ab0->data,(int)local_ab0->len);
              if (pBVar27 != (BIO *)0x0) {
                ERR_clear_error();
                local_a80 = PEM_read_bio_X509_AUX(pBVar27,(X509 **)0x0,passwd_callback,pcVar23);
                iVar15 = 0;
                if (local_a80 != (X509 *)0x0) {
                  iVar16 = SSL_CTX_use_certificate(local_a78,local_a80);
                  uVar37 = ERR_peek_error();
                  if (uVar37 != 0) {
                    iVar16 = 0;
                  }
                  iVar15 = 0;
                  local_9f0 = iVar16;
                  if (iVar16 != 0) {
                    lVar53 = SSL_CTX_ctrl(local_a78,0x58,0,(void *)0x0);
                    iVar15 = 0;
                    if (lVar53 != 0) {
                      do {
                        pXVar29 = PEM_read_bio_X509(pBVar27,(X509 **)0x0,passwd_callback,pcVar23);
                        if (pXVar29 == (X509 *)0x0) {
                          uVar37 = ERR_peek_last_error();
                          iVar15 = 0;
                          if ((int)uVar37 == 0x480006c) {
                            ERR_clear_error();
                            iVar15 = local_9f0;
                          }
                          goto LAB_001508e7;
                        }
                        lVar53 = SSL_CTX_ctrl(local_a78,0x59,0,pXVar29);
                      } while (lVar53 != 0);
                      X509_free(pXVar29);
                      iVar15 = 0;
                    }
                  }
                }
LAB_001508e7:
                X509_free(local_a80);
                BIO_free(pBVar27);
                goto LAB_001508f9;
              }
LAB_001509af:
              uVar37 = ERR_get_error();
              ossl_strerror(uVar37,error_buffer_1,size_12);
              pcVar38 = 
              "could not load PEM client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
              ;
              goto LAB_001509ce;
            }
            iVar15 = SSL_CTX_use_certificate_chain_file(local_a78,(char *)local_aa8);
LAB_001508f9:
            bVar62 = true;
            if (iVar15 != 1) goto LAB_001509af;
LAB_00150906:
            pcVar46 = local_9c8;
            pXVar29 = local_9d0;
            if (local_9c8 != (curl_blob *)0x0 || local_9d0 != (X509 *)0x0) {
              iVar13 = do_file_type(local_9e8);
              local_ab0 = pcVar46;
              local_aa8 = pXVar29;
            }
            if (iVar13 == 0x2b) {
              if (bVar62) {
                pcVar38 = "file type P12 for private key not supported";
                goto LAB_00150d23;
              }
LAB_00150b67:
              pSVar49 = SSL_new(local_a78);
              if (pSVar49 == (SSL *)0x0) {
                pcVar38 = "unable to create an SSL structure";
              }
              else {
                x509 = (X509 *)SSL_get_certificate(pSVar49);
                if ((X509 *)x509 != (X509 *)0x0) {
                  pEVar36 = X509_get_pubkey((X509 *)x509);
                  peVar51 = SSL_get_privatekey(pSVar49);
                  EVP_PKEY_copy_parameters(pEVar36,peVar51);
                  EVP_PKEY_free(pEVar36);
                }
                peVar51 = SSL_get_privatekey(pSVar49);
                iVar13 = EVP_PKEY_get_id(peVar51);
                if (iVar13 == 6) {
                  r = EVP_PKEY_get1_RSA(peVar51);
                  uVar17 = RSA_flags(r);
                  RSA_free(r);
                  SSL_free(pSVar49);
                  if ((uVar17 & 1) != 0) goto LAB_0014ef89;
                }
                else {
                  SSL_free(pSVar49);
                }
                iVar13 = SSL_CTX_check_private_key(local_a78);
                if (iVar13 != 0) goto LAB_0014ef89;
                pcVar38 = "Private key does not match the certificate public key";
              }
            }
            else {
              if (iVar13 == 2) {
LAB_00150960:
                if (local_ab0 == (curl_blob *)0x0) {
                  iVar13 = SSL_CTX_use_PrivateKey_file(local_a78,(char *)local_aa8,iVar13);
LAB_00150b5d:
                  if (iVar13 == 1) goto LAB_00150b67;
                }
                else {
                  pBVar27 = BIO_new_mem_buf(local_ab0->data,(int)local_ab0->len);
                  if (pBVar27 != (BIO *)0x0) {
                    if (iVar13 == 1) {
                      pEVar36 = PEM_read_bio_PrivateKey
                                          (pBVar27,(EVP_PKEY **)0x0,passwd_callback,pcVar23);
                    }
                    else {
                      pEVar36 = d2i_PrivateKey_bio(pBVar27,(EVP_PKEY **)0x0);
                    }
                    if (pEVar36 == (EVP_PKEY *)0x0) {
                      iVar13 = 0;
                    }
                    else {
                      iVar13 = SSL_CTX_use_PrivateKey(local_a78,pEVar36);
                      EVP_PKEY_free(pEVar36);
                    }
                    BIO_free(pBVar27);
                    goto LAB_00150b5d;
                  }
                }
                pXVar29 = (X509 *)"(memory blob)";
                if (local_aa8 != (X509 *)0x0) {
                  pXVar29 = local_aa8;
                }
                pcVar38 = "PEM";
                if (local_9e8 != (char *)0x0) {
                  pcVar38 = local_9e8;
                }
                pcVar23 = "unable to set private key file: \'%s\' type %s";
                local_aa8 = pXVar29;
                goto LAB_00150c30;
              }
              if (iVar13 == 0x2a) {
                if ((data->state).engine == (void *)0x0) {
                  _Var12 = is_pkcs11_uri((char *)local_aa8);
                  if ((_Var12) && (CVar14 = ossl_set_engine(data,"pkcs11"), CVar14 != CURLE_OK))
                  goto LAB_00150d2a;
                  if ((data->state).engine == (void *)0x0) {
                    pcVar38 = "crypto engine not set, can\'t load private key";
                    goto LAB_00150d23;
                  }
                }
                method = UI_create_method("curl user interface");
                if (method == (UI_METHOD *)0x0) {
                  pcVar38 = "unable do create OpenSSL user-interface method";
                }
                else {
                  pUVar50 = UI_OpenSSL();
                  iVar13 = UI_method_get_opener((UI *)pUVar50);
                  UI_method_set_opener(method,(opener *)CONCAT44(extraout_var,iVar13));
                  pUVar50 = UI_OpenSSL();
                  iVar13 = UI_method_get_closer((UI *)pUVar50);
                  UI_method_set_closer(method,(closer *)CONCAT44(extraout_var_00,iVar13));
                  UI_method_set_reader(method,ssl_ui_reader);
                  UI_method_set_writer(method,ssl_ui_writer);
                  pEVar36 = ENGINE_load_private_key
                                      ((ENGINE *)(data->state).engine,(char *)local_aa8,method,
                                       pcVar23);
                  UI_destroy_method(method);
                  if (pEVar36 != (EVP_PKEY *)0x0) {
                    iVar13 = SSL_CTX_use_PrivateKey(local_a78,pEVar36);
                    if (iVar13 != 1) {
                      Curl_failf(data,"unable to set private key");
                      EVP_PKEY_free(pEVar36);
                      goto LAB_00150d2a;
                    }
                    EVP_PKEY_free(pEVar36);
                    goto LAB_00150b67;
                  }
                  pcVar38 = "failed to load private key from crypto engine";
                }
              }
              else {
                if (iVar13 == 1) {
                  if (!bVar62) goto LAB_00150b67;
                  goto LAB_00150960;
                }
                pcVar38 = "not supported file type for private key";
              }
            }
LAB_00150d23:
            Curl_failf(data,pcVar38);
          }
LAB_00150d2a:
          uVar17 = 0x3a;
          goto LAB_0014ee0f;
        }
      }
LAB_0014ef89:
      cVar19 = (conn->http_proxy).proxytype;
      if ((cVar19 != CURLPROXY_HTTPS) ||
         (lVar53 = 0x340, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar53 = 0x2d0;
      }
      pcVar23 = *(char **)((conn->chunk).hexbuffer + lVar53 + -0x3d);
      if (pcVar23 == (char *)0x0) {
LAB_0014eff4:
        if ((cVar19 != CURLPROXY_HTTPS) ||
           (lVar53 = 0x348, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete))
        {
          lVar53 = 0x2d8;
        }
        pcVar23 = *(char **)((conn->chunk).hexbuffer + lVar53 + -0x3d);
        if (pcVar23 != (char *)0x0) {
          iVar13 = SSL_CTX_set_ciphersuites(psVar2->ctx,pcVar23);
          if (iVar13 == 0) {
            pcVar38 = "failed setting TLS 1.3 cipher suite: %s";
            goto LAB_0014f402;
          }
          Curl_infof(data,"TLS 1.3 cipher selection: %s",pcVar23);
        }
        sVar61 = ssl_connect_2;
        SSL_CTX_set_post_handshake_auth(psVar2->ctx,1);
        if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
           (lVar53 = 0x368, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete))
        {
          lVar53 = 0x2f8;
        }
        pcVar23 = *(char **)((conn->chunk).hexbuffer + lVar53 + -0x3d);
        if ((pcVar23 == (char *)0x0) ||
           (lVar53 = SSL_CTX_ctrl((SSL_CTX *)psVar2->ctx,0x5c,0,pcVar23), lVar53 != 0)) {
          local_a48 = local_a48 & 0xffffffff00000001;
          if ((char)local_a00 == '\0') {
            if (local_a18->len < 0x80000000) {
              pXVar47 = SSL_CTX_get_cert_store((SSL_CTX *)psVar2->ctx);
              uVar17 = 0x1b;
              if ((pXVar47 != (X509_STORE *)0x0) &&
                 (pXVar29 = (X509 *)BIO_new_mem_buf(local_a18->data,(int)local_a18->len),
                 pXVar29 != (X509 *)0x0)) {
                iVar13 = 0;
                local_a80 = pXVar29;
                psVar43 = PEM_X509_INFO_read_bio
                                    ((BIO *)pXVar29,(stack_st_X509_INFO *)0x0,(undefined1 *)0x0,
                                     (void *)0x0);
                if (psVar43 == (stack_st_X509_INFO *)0x0) {
                  BIO_free((BIO *)local_a80);
                }
                else {
                  iVar15 = 0;
                  for (; iVar16 = OPENSSL_sk_num(psVar43), iVar13 < iVar16; iVar13 = iVar13 + 1) {
                    puVar44 = (undefined8 *)OPENSSL_sk_value(psVar43,iVar13);
                    if ((X509 *)*puVar44 != (X509 *)0x0) {
                      iVar16 = X509_STORE_add_cert(pXVar47,(X509 *)*puVar44);
                      if (iVar16 != 0) {
                        iVar15 = iVar15 + 1;
                        goto LAB_0014f4bb;
                      }
LAB_0015062b:
                      iVar15 = 0;
                      break;
                    }
LAB_0014f4bb:
                    if ((X509_CRL *)puVar44[1] != (X509_CRL *)0x0) {
                      iVar16 = X509_STORE_add_crl(pXVar47,(X509_CRL *)puVar44[1]);
                      if (iVar16 == 0) goto LAB_0015062b;
                      iVar15 = iVar15 + 1;
                    }
                  }
                  OPENSSL_sk_pop_free(psVar43,X509_INFO_free);
                  BIO_free((BIO *)local_a80);
                  if (0 < iVar15) goto LAB_0014f0d3;
                }
                goto LAB_0014f3dc;
              }
            }
            else {
LAB_0014f3dc:
              if ((char)local_a48 == '\0') {
                Curl_infof(data,"error importing CA certificate blob, continuing anyway");
                goto LAB_0014f0d3;
              }
              uVar17 = 0x4d;
            }
            Curl_failf(data,"error importing CA certificate blob");
            local_a88 = (stack_st_X509 *)(ulong)uVar17;
            goto LAB_0014ee14;
          }
LAB_0014f0d3:
          if (local_a20 != 0) {
            iVar13 = SSL_CTX_load_verify_file(psVar2->ctx);
            if (iVar13 != 0) {
LAB_0014f0fe:
              Curl_infof(data," CAfile: %s",local_a20);
              goto LAB_0014f112;
            }
            if ((char)local_a48 == '\0') {
              Curl_infof(data,"error setting certificate file, continuing anyway");
              goto LAB_0014f0fe;
            }
            pcVar38 = "error setting certificate file: %s";
LAB_0014fffe:
            Curl_failf(data,pcVar38,local_a20);
            uVar17 = 0x4d;
            goto LAB_0014ee0f;
          }
LAB_0014f112:
          lVar53 = local_9f8;
          if (local_9f8 != 0) {
            iVar13 = SSL_CTX_load_verify_dir(psVar2->ctx,local_9f8);
            if (iVar13 == 0) {
              if ((char)local_a48 != '\0') {
                pcVar38 = "error setting certificate path: %s";
                local_a20 = local_9f8;
                goto LAB_0014fffe;
              }
              Curl_infof(data,"error setting certificate path, continuing anyway");
              lVar53 = local_9f8;
            }
            Curl_infof(data," CApath: %s",lVar53);
          }
          if (pcVar38 != (char *)0x0) {
            pXVar47 = SSL_CTX_get_cert_store((SSL_CTX *)psVar2->ctx);
            m = X509_LOOKUP_file();
            ctx = X509_STORE_add_lookup(pXVar47,m);
            if ((ctx == (X509_LOOKUP *)0x0) ||
               (iVar13 = X509_load_crl_file(ctx,pcVar38,1), iVar13 == 0)) {
              Curl_failf(data,"error loading CRL file: %s",pcVar38);
              uVar17 = 0x52;
              goto LAB_0014ee0f;
            }
            Curl_infof(data,"successfully load CRL file:");
            pXVar47 = SSL_CTX_get_cert_store((SSL_CTX *)psVar2->ctx);
            X509_STORE_set_flags(pXVar47,0xc);
            Curl_infof(data,"  CRLfile: %s",pcVar38);
          }
          if ((char)local_a48 != '\0') {
            pXVar47 = SSL_CTX_get_cert_store((SSL_CTX *)psVar2->ctx);
            X509_STORE_set_flags(pXVar47,0x8000);
            if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
               (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
              if (pcVar38 == (char *)0x0) {
                bVar11 = (data->set).proxy_ssl.field_0xc8;
LAB_0015030d:
                if ((bVar11 & 0x10) == 0) {
                  pXVar47 = SSL_CTX_get_cert_store((SSL_CTX *)psVar2->ctx);
                  X509_STORE_set_flags(pXVar47,0x80000);
                }
              }
            }
            else if (pcVar38 == (char *)0x0) {
              bVar11 = (data->set).ssl.field_0xc8;
              goto LAB_0015030d;
            }
          }
          SSL_CTX_set_verify((SSL_CTX *)psVar2->ctx,(int)local_a48,(callback *)0x0);
          _Var12 = Curl_tls_keylog_enabled();
          if (_Var12) {
            SSL_CTX_set_keylog_callback(psVar2->ctx,ossl_keylog_callback);
          }
          SSL_CTX_ctrl((SSL_CTX *)psVar2->ctx,0x2c,0x301,(void *)0x0);
          SSL_CTX_sess_set_new_cb((SSL_CTX *)psVar2->ctx,ossl_new_session_cb);
          if ((data->set).ssl.fsslctx != (curl_ssl_ctx_callback)0x0) {
            Curl_set_in_callback(data,true);
            CVar14 = (*(data->set).ssl.fsslctx)(data,psVar2->ctx,(data->set).ssl.fsslctxp);
            Curl_set_in_callback(data,false);
            if (CVar14 != CURLE_OK) {
              Curl_failf(data,"error signaled by ssl ctx callback");
              local_a88 = (stack_st_X509 *)(ulong)CVar14;
              goto LAB_0014ee14;
            }
          }
          if ((SSL *)psVar2->handle != (SSL *)0x0) {
            SSL_free((SSL *)psVar2->handle);
          }
          pSVar49 = SSL_new((SSL_CTX *)psVar2->ctx);
          psVar2->handle = (SSL *)pSVar49;
          if (pSVar49 == (SSL *)0x0) {
            Curl_failf(data,"SSL: couldn\'t create a context (handle)!");
            goto LAB_0014e547;
          }
          if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
             (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
            bVar11 = (conn->proxy_ssl_config).field_0x68;
          }
          else {
            bVar11 = (conn->ssl_config).field_0x68;
          }
          if ((bVar11 & 4) != 0) {
            SSL_ctrl(pSVar49,0x41,1,(void *)0x0);
            pSVar49 = (SSL *)psVar2->handle;
          }
          SSL_set_connect_state(pSVar49);
          pcVar38 = local_a08;
          psVar2->server_cert = (X509 *)0x0;
          iVar13 = inet_pton(2,local_a08,&addr);
          if ((iVar13 == 0) && (iVar13 = inet_pton(10,pcVar38,&addr), iVar13 == 0)) {
            sVar45 = strlen(pcVar38);
            if ((data->set).buffer_size <= (long)sVar45) goto LAB_0014ee14;
            Curl_strntolower((data->state).buffer,local_a08,sVar45);
            (data->state).buffer[sVar45] = '\0';
            lVar53 = SSL_ctrl((SSL *)psVar2->handle,0x37,0,(data->state).buffer);
            if (lVar53 == 0) {
              Curl_infof(data,
                         "WARNING: failed to configure server name indication (SNI) TLS extension");
            }
          }
          ossl_associate_connection(data,conn,sockindex);
          Curl_ssl_sessionid_lock(data);
          if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
            _Var12 = conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete;
          }
          else {
            _Var12 = false;
          }
          _Var12 = Curl_ssl_getsessionid(data,conn,_Var12,&ssl_sessionid,(size_t *)0x0,sockindex);
          if (!_Var12) {
            iVar13 = SSL_set_session((SSL *)psVar2->handle,(SSL_SESSION *)ssl_sessionid);
            if (iVar13 != 0) {
              Curl_infof(data,"SSL re-using session ID");
              goto LAB_00150553;
            }
            Curl_ssl_sessionid_unlock(data);
            uVar37 = ERR_get_error();
            ossl_strerror(uVar37,error_buffer,size_09);
            pcVar38 = "SSL: SSL_set_session failed: %s";
LAB_00150753:
            Curl_failf(data,pcVar38,error_buffer);
            goto LAB_0014ee14;
          }
LAB_00150553:
          Curl_ssl_sessionid_unlock(data);
          if ((conn->proxy_ssl[lVar52].field_0x10 & 1) == 0) {
            iVar13 = SSL_set_fd((SSL *)psVar2->handle,local_9ec);
            if (iVar13 == 0) {
              uVar37 = ERR_get_error();
              ossl_strerror(uVar37,error_buffer,size_06);
              pcVar38 = "SSL: SSL_set_fd failed: %s";
              goto LAB_00150753;
            }
          }
          else {
            pBVar26 = BIO_f_ssl();
            pBVar27 = BIO_new(pBVar26);
            BIO_ctrl(pBVar27,0x6d,0,(conn->proxy_ssl[lVar52].backend)->handle);
            SSL_set_bio((SSL *)psVar2->handle,pBVar27,pBVar27);
          }
          local_a90->connecting_state = ssl_connect_2;
          goto LAB_0014d5a1;
        }
        pcVar38 = "failed setting curves list: \'%s\'";
      }
      else {
        iVar13 = SSL_CTX_set_cipher_list((SSL_CTX *)psVar2->ctx,pcVar23);
        if (iVar13 != 0) {
          Curl_infof(data,"Cipher selection: %s",pcVar23);
          cVar19 = (conn->http_proxy).proxytype;
          goto LAB_0014eff4;
        }
        pcVar38 = "failed setting cipher list: %s";
      }
LAB_0014f402:
      Curl_failf(data,pcVar38,pcVar23);
      uVar17 = 0x3b;
    }
LAB_0014ee0f:
    local_a88 = (stack_st_X509 *)(ulong)uVar17;
LAB_0014ee14:
    return (CURLcode)local_a88;
  }
LAB_0014d5a1:
  pcVar38 = error_buffer;
  while (psVar60 = local_a90, sVar61 - ssl_connect_2 < 3) {
    tVar22 = Curl_timeleft(data,(curltime *)0x0,true);
    psVar60 = local_a90;
    if (tVar22 < 0) goto LAB_0014d949;
    sVar61 = local_a90->connecting_state;
    if ((sVar61 & ~ssl_connect_2) == ssl_connect_2_reading) {
      writefd = -1;
      if (sVar61 == ssl_connect_2_writing) {
        writefd = (curl_socket_t)local_a58;
      }
      readfd0 = -1;
      if (sVar61 == ssl_connect_2_reading) {
        readfd0 = (curl_socket_t)local_a58;
      }
      if ((byte)local_a70 != '\0') {
        tVar22 = 0;
      }
      iVar13 = Curl_socket_check(readfd0,-1,writefd,tVar22);
      if (iVar13 < 0) {
        puVar25 = (uint *)__errno_location();
        Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar25);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if (iVar13 == 0) {
        if ((byte)local_a70 != '\0') {
          *local_9e0 = false;
          return CURLE_OK;
        }
        goto LAB_0014d949;
      }
    }
    psVar2 = psVar60->backend;
    ERR_clear_error();
    iVar13 = SSL_connect((SSL *)psVar2->handle);
    if (iVar13 == 1) {
      psVar60->connecting_state = ssl_connect_3;
      pcVar23 = SSL_get_version((SSL *)psVar2->handle);
      c = SSL_get_current_cipher((SSL *)psVar2->handle);
      pcVar24 = SSL_CIPHER_get_name(c);
      psVar60 = local_a90;
      Curl_infof(data,"SSL connection using %s / %s",pcVar23,pcVar24);
      if (((conn->bits).field_0x7 & 0x10) != 0) {
        SSL_get0_alpn_selected(psVar2->handle,error_buffer_1,pcVar38);
        if (error_buffer._0_4_ == 0) {
          Curl_infof(data,"ALPN, server did not agree to a protocol");
        }
        else {
          Curl_infof(data,"ALPN, server accepted to use %.*s",error_buffer._0_8_ & 0xffffffff,
                     CONCAT71(error_buffer_1._1_7_,error_buffer_1[0]));
          if ((error_buffer._0_4_ == 8) &&
             (*(long *)CONCAT71(error_buffer_1._1_7_,error_buffer_1[0]) == 0x312e312f70747468)) {
            conn->negnpn = 2;
          }
        }
        Curl_multiuse_state(data,(uint)(conn->negnpn == 3) * 3 + -1);
        psVar60 = local_a90;
      }
    }
    else {
      iVar13 = SSL_get_error((SSL *)psVar2->handle,iVar13);
      psVar60 = local_a90;
      if (iVar13 == 9) {
        local_a90->connecting_state = ssl_connect_2;
      }
      else if (iVar13 == 3) {
        local_a90->connecting_state = ssl_connect_2_writing;
      }
      else {
        if (iVar13 != 2) {
          memset(error_buffer_1,0,0x100);
          local_a90->connecting_state = ssl_connect_2;
          uVar37 = ERR_get_error();
          uVar17 = (uint)uVar37;
          if ((uVar17 & 0xff800000) == 0xa000000 && -1 < (int)uVar17) {
            uVar17 = uVar17 & 0x7fffff;
            if (uVar17 != 0x86) {
              if (uVar17 == 0x45c) {
                ossl_strerror(uVar37,error_buffer_1,size);
                CVar14 = CURLE_SSL_CLIENTCERT;
                goto LAB_0014ee5f;
              }
              if (uVar17 != 0x415) goto LAB_0014e564;
            }
            lVar52 = SSL_get_verify_result((SSL *)psVar2->handle);
            if (lVar52 == 0) {
              builtin_strncpy(error_buffer_1,"SSL certificate verification failed",0x24);
              CVar14 = CURLE_PEER_FAILED_VERIFICATION;
            }
            else {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar53 = 0x6e0,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar53 = 0x610;
              }
              *(long *)((long)&data->magic + lVar53) = lVar52;
              pcVar38 = X509_verify_cert_error_string(lVar52);
              curl_msnprintf(error_buffer_1,0x100,"SSL certificate problem: %s",pcVar38);
              CVar14 = CURLE_PEER_FAILED_VERIFICATION;
            }
LAB_0014ee5f:
            Curl_failf(data,"%s",error_buffer_1);
            return CVar14;
          }
LAB_0014e564:
          ossl_strerror(uVar37,error_buffer_1,size);
          CVar14 = CURLE_SSL_CONNECT_ERROR;
          if (uVar37 != 0) goto LAB_0014ee5f;
          if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
            bVar62 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
            ppVar5 = &conn->http_proxy;
            if (bVar62) {
              ppVar5 = (proxy_info *)&conn->host;
            }
            lVar52 = (ulong)bVar62 * 4 + 0x160;
          }
          else {
            ppVar5 = (proxy_info *)&conn->host;
            lVar52 = 0x164;
          }
          pcVar23 = (ppVar5->host).name;
          iVar15 = *(int *)((conn->chunk).hexbuffer + lVar52 + -0x3d);
          error_buffer[0x40] = '\0';
          error_buffer[0x41] = '\0';
          error_buffer[0x42] = '\0';
          error_buffer[0x43] = '\0';
          error_buffer[0x44] = '\0';
          error_buffer[0x45] = '\0';
          error_buffer[0x46] = '\0';
          error_buffer[0x47] = '\0';
          error_buffer[0x48] = '\0';
          error_buffer[0x49] = '\0';
          error_buffer[0x4a] = '\0';
          error_buffer[0x4b] = '\0';
          error_buffer[0x4c] = '\0';
          error_buffer[0x4d] = '\0';
          error_buffer[0x4e] = '\0';
          error_buffer[0x4f] = '\0';
          error_buffer[0x30] = '\0';
          error_buffer[0x31] = '\0';
          error_buffer[0x32] = '\0';
          error_buffer[0x33] = '\0';
          error_buffer[0x34] = '\0';
          error_buffer[0x35] = '\0';
          error_buffer[0x36] = '\0';
          error_buffer[0x37] = '\0';
          error_buffer[0x38] = '\0';
          error_buffer[0x39] = '\0';
          error_buffer[0x3a] = '\0';
          error_buffer[0x3b] = '\0';
          error_buffer[0x3c] = '\0';
          error_buffer[0x3d] = '\0';
          error_buffer[0x3e] = '\0';
          error_buffer[0x3f] = '\0';
          error_buffer[0x20] = '\0';
          error_buffer[0x21] = '\0';
          error_buffer[0x22] = '\0';
          error_buffer[0x23] = '\0';
          error_buffer[0x24] = '\0';
          error_buffer[0x25] = '\0';
          error_buffer[0x26] = '\0';
          error_buffer[0x27] = '\0';
          error_buffer[0x28] = '\0';
          error_buffer[0x29] = '\0';
          error_buffer[0x2a] = '\0';
          error_buffer[0x2b] = '\0';
          error_buffer[0x2c] = '\0';
          error_buffer[0x2d] = '\0';
          error_buffer[0x2e] = '\0';
          error_buffer[0x2f] = '\0';
          error_buffer[0x10] = '\0';
          error_buffer[0x11] = '\0';
          error_buffer[0x12] = '\0';
          error_buffer[0x13] = '\0';
          error_buffer[0x14] = '\0';
          error_buffer[0x15] = '\0';
          error_buffer[0x16] = '\0';
          error_buffer[0x17] = '\0';
          error_buffer[0x18] = '\0';
          error_buffer[0x19] = '\0';
          error_buffer[0x1a] = '\0';
          error_buffer[0x1b] = '\0';
          error_buffer[0x1c] = '\0';
          error_buffer[0x1d] = '\0';
          error_buffer[0x1e] = '\0';
          error_buffer[0x1f] = '\0';
          error_buffer[0] = '\0';
          error_buffer[1] = '\0';
          error_buffer[2] = '\0';
          error_buffer[3] = '\0';
          error_buffer[4] = '\0';
          error_buffer[5] = '\0';
          error_buffer[6] = '\0';
          error_buffer[7] = '\0';
          error_buffer[8] = '\0';
          error_buffer[9] = '\0';
          error_buffer[10] = '\0';
          error_buffer[0xb] = '\0';
          error_buffer[0xc] = '\0';
          error_buffer[0xd] = '\0';
          error_buffer[0xe] = '\0';
          error_buffer[0xf] = '\0';
          piVar41 = __errno_location();
          if (iVar13 == 5 && *piVar41 != 0) {
            Curl_strerror(*piVar41,pcVar38,0x50);
            if (error_buffer[0] != '\0') goto LAB_0014ecac;
          }
          pcVar38 = SSL_ERROR_to_str(iVar13);
LAB_0014ecac:
          Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar38,pcVar23,
                     (long)iVar15);
          return CURLE_SSL_CONNECT_ERROR;
        }
        local_a90->connecting_state = ssl_connect_2_reading;
      }
    }
    sVar61 = psVar60->connecting_state;
    if (((byte)local_a70 != '\0') && (sVar61 - ssl_connect_2 < 3)) {
      return CURLE_OK;
    }
  }
  if (sVar61 == ssl_connect_3) {
    if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
      if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
        bVar11 = (conn->ssl_config).field_0x68;
      }
      else {
        bVar11 = (conn->proxy_ssl_config).field_0x68;
      }
    }
    else {
      bVar11 = (conn->ssl_config).field_0x68;
    }
    bVar10 = 1;
    if ((bVar11 & 1) == 0) {
      bVar10 = (bVar11 & 2) >> 1;
    }
    memset(error_buffer,0,0x100);
    pBVar26 = BIO_s_mem();
    pBVar27 = BIO_new(pBVar26);
    psVar2 = psVar60->backend;
    if ((((data->set).ssl.field_0xc8 & 1) != 0) &&
       (psVar28 = SSL_get_peer_cert_chain((SSL *)psVar2->handle), psVar28 != (stack_st_X509 *)0x0))
    {
      local_a88 = psVar28;
      iVar13 = OPENSSL_sk_num(psVar28);
      CVar14 = Curl_ssl_init_certinfo(data,iVar13);
      if (CVar14 == CURLE_OK) {
        local_a80 = (X509 *)CONCAT71(local_a80._1_7_,bVar10);
        pBVar26 = BIO_s_mem();
        a = BIO_new(pBVar26);
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        for (iVar15 = 0; iVar15 != iVar13; iVar15 = iVar15 + 1) {
          pXVar29 = (X509 *)OPENSSL_sk_value(local_a88,iVar15);
          psig = (ASN1_BIT_STRING *)0x0;
          pXVar30 = X509_get_subject_name(pXVar29);
          X509_NAME_print_ex(a,pXVar30,0,0x82031f);
          sVar31 = BIO_ctrl(a,3,0,&x509);
          Curl_ssl_push_certinfo_len(data,iVar15,"Subject",(char *)x509,sVar31);
          BIO_ctrl(a,1,0,(void *)0x0);
          pXVar30 = X509_get_issuer_name(pXVar29);
          X509_NAME_print_ex(a,pXVar30,0,0x82031f);
          sVar31 = BIO_ctrl(a,3,0,&x509);
          Curl_ssl_push_certinfo_len(data,iVar15,"Issuer",(char *)x509,sVar31);
          BIO_ctrl(a,1,0,(void *)0x0);
          uVar32 = X509_get_version(pXVar29);
          BIO_printf(a,"%lx",uVar32);
          sVar31 = BIO_ctrl(a,3,0,&x509);
          local_a70 = (X509 *)CONCAT44(local_a70._4_4_,iVar15);
          Curl_ssl_push_certinfo_len(data,iVar15,"Version",(char *)x509,sVar31);
          BIO_ctrl(a,1,0,(void *)0x0);
          local_a58 = pXVar29;
          pAVar33 = X509_get_serialNumber(pXVar29);
          if (pAVar33->type == 0x102) {
            BIO_puts(a,"-");
          }
          for (lVar52 = 0; lVar52 < pAVar33->length; lVar52 = lVar52 + 1) {
            BIO_printf(a,"%02x",(ulong)pAVar33->data[lVar52]);
          }
          sVar31 = BIO_ctrl(a,3,0,&x509);
          iVar15 = (int)local_a70;
          Curl_ssl_push_certinfo_len(data,(int)local_a70,"Serial Number",(char *)x509,sVar31);
          BIO_ctrl(a,1,0,(void *)0x0);
          ssl_sessionid = (void *)0x0;
          pubkeyoid = (ASN1_OBJECT *)0x0;
          X509_get0_signature(&psig,&ssl_sessionid,local_a58);
          if (ssl_sessionid != (void *)0x0) {
            i2a_ASN1_OBJECT(a,*ssl_sessionid);
            sVar31 = BIO_ctrl(a,3,0,&x509);
            Curl_ssl_push_certinfo_len(data,iVar15,"Signature Algorithm",(char *)x509,sVar31);
            BIO_ctrl(a,1,0,(void *)0x0);
          }
          pXVar34 = (X509_PUBKEY *)X509_get_X509_PUBKEY(local_a58);
          if ((pXVar34 != (X509_PUBKEY *)0x0) &&
             (X509_PUBKEY_get0_param
                        ((ASN1_OBJECT **)&pubkeyoid,(uchar **)0x0,(int *)0x0,(X509_ALGOR **)0x0,
                         pXVar34), pubkeyoid != (ASN1_OBJECT *)0x0)) {
            i2a_ASN1_OBJECT(a,(ASN1_OBJECT *)pubkeyoid);
            sVar31 = BIO_ctrl(a,3,0,&x509);
            Curl_ssl_push_certinfo_len
                      (data,(int)local_a70,"Public Key Algorithm",(char *)x509,sVar31);
            BIO_ctrl(a,1,0,(void *)0x0);
          }
          uVar32 = X509_get0_extensions(local_a58);
          iVar15 = OPENSSL_sk_num(uVar32);
          if (0 < iVar15) {
            for (iVar15 = 0; iVar16 = OPENSSL_sk_num(uVar32), iVar15 < iVar16; iVar15 = iVar15 + 1)
            {
              ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar32,iVar15);
              pBVar26 = BIO_s_mem();
              out = BIO_new(pBVar26);
              if (out == (BIO *)0x0) break;
              a_00 = X509_EXTENSION_get_object(ex);
              i2t_ASN1_OBJECT((char *)&params,0x80,a_00);
              iVar16 = X509V3_EXT_print(out,ex,0,0);
              if (iVar16 == 0) {
                v = X509_EXTENSION_get_data(ex);
                ASN1_STRING_print(out,v);
              }
              BIO_ctrl(out,0x73,0,&addr);
              Curl_ssl_push_certinfo_len
                        (data,(int)local_a70,(char *)&params,*(char **)(addr.__in6_u._0_8_ + 8),
                         *(size_t *)addr.__in6_u._0_8_);
              BIO_free(out);
            }
          }
          pXVar29 = local_a58;
          pAVar35 = (ASN1_TIME *)X509_get0_notBefore(local_a58);
          ASN1_TIME_print(a,pAVar35);
          sVar31 = BIO_ctrl(a,3,0,&x509);
          iVar15 = (int)local_a70;
          Curl_ssl_push_certinfo_len(data,(int)local_a70,"Start date",(char *)x509,sVar31);
          BIO_ctrl(a,1,0,(void *)0x0);
          pAVar35 = (ASN1_TIME *)X509_get0_notAfter(pXVar29);
          ASN1_TIME_print(a,pAVar35);
          sVar31 = BIO_ctrl(a,3,0,&x509);
          Curl_ssl_push_certinfo_len(data,iVar15,"Expire date",(char *)x509,sVar31);
          BIO_ctrl(a,1,0,(void *)0x0);
          pEVar36 = X509_get_pubkey(pXVar29);
          if (pEVar36 == (EVP_PKEY *)0x0) {
            Curl_infof(data,"   Unable to load public key");
          }
          else {
            iVar15 = EVP_PKEY_get_id(pEVar36);
            if (iVar15 == 0x74) {
              uVar32 = EVP_PKEY_get0_DSA(pEVar36);
              DSA_get0_pqg(uVar32,&params,&addr,&ssl_sessionid);
              DSA_get0_key(uVar32,&pubkeyoid,0);
              pcVar38 = "dsa";
              iVar15 = (int)local_a70;
LAB_0014e14c:
              pubkey_show(data,(BIO *)a,iVar15,pcVar38,"p",(BIGNUM *)params.cert_id);
              pubkey_show(data,(BIO *)a,iVar15,pcVar38,"q",(BIGNUM *)addr.__in6_u._0_8_);
              pubkey_show(data,(BIO *)a,iVar15,pcVar38,"g",(BIGNUM *)ssl_sessionid);
              pcVar23 = "pub_key";
              uVar32 = pubkeyoid;
LAB_0014e1b3:
              pubkey_show(data,(BIO *)a,iVar15,pcVar38,pcVar23,(BIGNUM *)uVar32);
            }
            else {
              if (iVar15 == 0x1c) {
                uVar32 = EVP_PKEY_get0_DH(pEVar36);
                DH_get0_pqg(uVar32,&params,&addr,&ssl_sessionid);
                DH_get0_key(uVar32,&pubkeyoid,0);
                pcVar38 = "dh";
                iVar15 = (int)local_a70;
                goto LAB_0014e14c;
              }
              if (iVar15 == 6) {
                uVar32 = EVP_PKEY_get0_RSA(pEVar36);
                RSA_get0_key(uVar32,&params,&addr,0);
                uVar17 = BN_num_bits((BIGNUM *)params.cert_id);
                BIO_printf(a,"%d",(ulong)uVar17);
                sVar31 = BIO_ctrl(a,3,0,&x509);
                iVar15 = (int)local_a70;
                Curl_ssl_push_certinfo_len(data,(int)local_a70,"RSA Public Key",(char *)x509,sVar31)
                ;
                BIO_ctrl(a,1,0,(void *)0x0);
                pubkey_show(data,(BIO *)a,iVar15,"rsa","n",(BIGNUM *)params.cert_id);
                pcVar38 = "rsa";
                pcVar23 = "e";
                uVar32 = addr.__in6_u._0_8_;
                goto LAB_0014e1b3;
              }
            }
            EVP_PKEY_free(pEVar36);
          }
          if (psig != (ASN1_BIT_STRING *)0x0) {
            for (lVar52 = 0; lVar52 < psig->length; lVar52 = lVar52 + 1) {
              BIO_printf(a,"%02x:",(ulong)psig->data[lVar52]);
            }
            sVar31 = BIO_ctrl(a,3,0,&x509);
            Curl_ssl_push_certinfo_len(data,(int)local_a70,"Signature",(char *)x509,sVar31);
            BIO_ctrl(a,1,0,(void *)0x0);
          }
          PEM_write_bio_X509(a,local_a58);
          sVar31 = BIO_ctrl(a,3,0,&x509);
          iVar15 = (int)local_a70;
          Curl_ssl_push_certinfo_len(data,(int)local_a70,"Cert",(char *)x509,sVar31);
          BIO_ctrl(a,1,0,(void *)0x0);
        }
        BIO_free(a);
        bVar10 = (byte)local_a80;
      }
    }
    pXVar40 = (X509 *)SSL_get1_peer_certificate(psVar2->handle);
    psVar2->server_cert = pXVar40;
    if (pXVar40 == (X509 *)0x0) {
      BIO_free(pBVar27);
      psVar60 = local_a90;
      if (bVar10 != 0) {
        Curl_failf(data,"SSL: couldn\'t get peer certificate!");
        return CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    else {
      local_a80 = (X509 *)CONCAT71(local_a80._1_7_,bVar10);
      if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
        pcVar38 = "Proxy";
        if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
          pcVar38 = "Server";
        }
      }
      else {
        pcVar38 = "Server";
      }
      Curl_infof(data,"%s certificate:",pcVar38);
      pXVar30 = X509_get_subject_name((X509 *)psVar2->server_cert);
      iVar13 = x509_name_oneline((X509_NAME *)pXVar30,error_buffer_1,size_01);
      pcVar38 = "[NONE]";
      if (iVar13 == 0) {
        pcVar38 = error_buffer_1;
      }
      Curl_infof(data," subject: %s",pcVar38);
      pAVar35 = (ASN1_TIME *)X509_get0_notBefore(psVar2->server_cert);
      ASN1_TIME_print(pBVar27,pAVar35);
      uVar37 = BIO_ctrl(pBVar27,3,0,&local_9c0);
      Curl_infof(data," start date: %.*s",uVar37 & 0xffffffff);
      BIO_ctrl(pBVar27,1,0,(void *)0x0);
      pAVar35 = (ASN1_TIME *)X509_get0_notAfter(psVar2->server_cert);
      ASN1_TIME_print(pBVar27,pAVar35);
      uVar37 = BIO_ctrl(pBVar27,3,0,&local_9c0);
      Curl_infof(data," expire date: %.*s",uVar37 & 0xffffffff);
      BIO_ctrl(pBVar27,1,0,(void *)0x0);
      BIO_free(pBVar27);
      cVar19 = (conn->http_proxy).proxytype;
      psVar60 = local_a90;
      if ((cVar19 == CURLPROXY_HTTPS) &&
         (iVar13 = conn->sock[1], conn->proxy_ssl[iVar13 != -1].state != ssl_connection_complete)) {
        if (((conn->proxy_ssl_config).field_0x68 & 2) != 0) {
          pXVar29 = (X509 *)psVar2->server_cert;
LAB_0014e874:
          bVar62 = conn->proxy_ssl[iVar13 != -1].state == ssl_connection_complete;
          ppVar5 = &conn->http_proxy;
          if (bVar62) {
            ppVar5 = (proxy_info *)&conn->host;
          }
          ppcVar42 = &(ppVar5->host).name;
          lVar52 = 0x138;
          if (bVar62) {
            lVar52 = 0xa8;
          }
LAB_0014e8b6:
          pcVar38 = *ppcVar42;
          uVar32 = *(undefined8 *)((conn->chunk).hexbuffer + lVar52 + -0x3d);
          if ((((conn->bits).field_0x5 & 0x10) == 0) ||
             (iVar13 = inet_pton(10,pcVar38,&params), iVar13 == 0)) {
            iVar13 = inet_pton(2,pcVar38,&params);
            psVar28 = (stack_st_X509 *)(ulong)((uint)(iVar13 != 0) * 4);
            iVar13 = (uint)(iVar13 != 0) * 5 + 2;
          }
          else {
            iVar13 = 7;
            psVar28 = (stack_st_X509 *)0x10;
          }
          pXVar48 = (X509 *)0x0;
          a_01 = (GENERAL_NAMES *)X509_get_ext_d2i(pXVar29,0x55,(int *)0x0,(int *)0x0);
          if (a_01 != (GENERAL_NAMES *)0x0) {
            local_a88 = psVar28;
            iVar15 = OPENSSL_sk_num(a_01);
            iVar16 = 0;
            bVar62 = false;
            local_a48 = 0;
            local_a70 = (X509 *)0x0;
            local_a58 = (X509 *)0x0;
            while ((iVar16 < iVar15 && (!bVar62))) {
              piVar41 = (int *)OPENSSL_sk_value(a_01,iVar16);
              iVar18 = *piVar41;
              uVar59 = (undefined7)((ulong)pXVar48 >> 8);
              if (iVar18 == 2) {
                pXVar48 = (X509 *)CONCAT71(uVar59,1);
                local_a58 = pXVar48;
              }
              else if (iVar18 == 7) {
                pXVar48 = (X509 *)CONCAT71(uVar59,1);
                local_a70 = pXVar48;
              }
              if (iVar18 == iVar13) {
                __s = (X509 *)ASN1_STRING_get0_data(*(undefined8 *)(piVar41 + 2));
                iVar18 = ASN1_STRING_length(*(ASN1_STRING **)(piVar41 + 2));
                if (iVar13 == 7) {
                  if ((local_a88 != (stack_st_X509 *)(long)iVar18) ||
                     (iVar18 = bcmp(__s,&params,(size_t)local_a88), iVar18 != 0)) goto LAB_0014ea2e;
                  bVar62 = false;
                  Curl_infof(data," subjectAltName: host \"%s\" matched cert\'s IP address!",uVar32)
                  ;
                  local_a48 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                }
                else {
                  if (((iVar13 != 2) ||
                      (psVar28 = (stack_st_X509 *)strlen((char *)__s),
                      psVar28 != (stack_st_X509 *)(long)iVar18)) ||
                     (iVar18 = Curl_cert_hostcheck((char *)__s,pcVar38), iVar18 == 0))
                  goto LAB_0014ea2e;
                  Curl_infof(data," subjectAltName: host \"%s\" matched cert\'s \"%s\"",uVar32);
                  bVar62 = true;
                  pXVar48 = __s;
                }
              }
              else {
LAB_0014ea2e:
                bVar62 = false;
              }
              iVar16 = iVar16 + 1;
            }
            GENERAL_NAMES_free(a_01);
            psVar60 = local_a90;
            if (bVar62 || (local_a48 & 1) != 0) goto LAB_0014f5d7;
            if ((((byte)local_a58 | (byte)local_a70) & 1) != 0) {
              Curl_infof(data," subjectAltName does not match %s",uVar32);
              Curl_failf(data,
                         "SSL: no alternative certificate subject name matches target host name \'%s\'"
                         ,uVar32);
              CVar14 = CURLE_PEER_FAILED_VERIFICATION;
              goto LAB_0014f5c4;
            }
          }
          addr.__in6_u._0_8_ =
               (long)"n,a=%s,\x01host=%s\x01port=%ld\x01auth=Bearer %s\x01\x01" + 0x29;
          pXVar30 = X509_get_subject_name(pXVar29);
          if (pXVar30 == (X509_NAME *)0x0) {
LAB_0014f51c:
            if ((char *)addr.__in6_u._0_8_ == "") {
              addr.__in6_u._0_8_ = 0;
              goto LAB_0014f57d;
            }
            if (addr.__in6_u._0_8_ == 0) goto LAB_0014f57d;
            iVar13 = Curl_cert_hostcheck((char *)addr.__in6_u._0_8_,pcVar38);
            if (iVar13 == 0) {
              Curl_failf(data,
                         "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                         ,addr.__in6_u._0_8_);
              goto LAB_0014f593;
            }
            CVar14 = CURLE_OK;
            Curl_infof(data," common name: %s (matched)");
          }
          else {
            iVar13 = -1;
            do {
              iVar15 = iVar13;
              iVar13 = X509_NAME_get_index_by_NID(pXVar30,0xd,iVar15);
            } while (-1 < iVar13);
            if (iVar15 < 0) goto LAB_0014f51c;
            ne = X509_NAME_get_entry(pXVar30,iVar15);
            x = X509_NAME_ENTRY_get_data(ne);
            if (x == (ASN1_STRING *)0x0) goto LAB_0014f51c;
            iVar13 = ASN1_STRING_type(x);
            if (iVar13 == 0xc) {
              uVar17 = ASN1_STRING_length(x);
              if ((int)uVar17 < 0) {
                uVar32 = "";
              }
              else {
                uVar32 = CRYPTO_malloc(uVar17 + 1,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/Rachelmorrell[P]curl/lib/vtls/openssl.c"
                                       ,0x6fa);
                addr.__in6_u._0_8_ = uVar32;
                if ((char *)uVar32 == (char *)0x0) goto LAB_0014f57d;
                __src = (void *)ASN1_STRING_get0_data(x);
                memcpy((void *)uVar32,__src,(ulong)uVar17);
                *(char *)(uVar32 + (ulong)uVar17) = '\0';
              }
LAB_0014f504:
              sVar45 = strlen((char *)uVar32);
              uVar20 = curlx_uztosi(sVar45);
              if (uVar20 == uVar17) goto LAB_0014f51c;
              Curl_failf(data,"SSL: illegal cert name field");
              CVar14 = CURLE_PEER_FAILED_VERIFICATION;
              if ((char *)addr.__in6_u._0_8_ == "") goto LAB_0014f5c4;
              goto LAB_0014f5a9;
            }
            uVar17 = ASN1_STRING_to_UTF8((uchar **)&addr,x);
            uVar32 = addr.__in6_u._0_8_;
            if (addr.__in6_u._0_8_ != 0) goto LAB_0014f504;
LAB_0014f57d:
            Curl_failf(data,"SSL: unable to obtain common name from peer certificate");
LAB_0014f593:
            CVar14 = CURLE_PEER_FAILED_VERIFICATION;
          }
LAB_0014f5a9:
          psVar60 = local_a90;
          if (addr.__in6_u._0_8_ != 0) {
            CRYPTO_free((void *)addr.__in6_u._0_8_);
          }
          if (CVar14 != CURLE_OK) {
LAB_0014f5c4:
            X509_free((X509 *)psVar2->server_cert);
            psVar2->server_cert = (X509 *)0x0;
            return CVar14;
          }
        }
      }
      else if (((conn->ssl_config).field_0x68 & 2) != 0) {
        pXVar29 = (X509 *)psVar2->server_cert;
        if (cVar19 == CURLPROXY_HTTPS) {
          iVar13 = conn->sock[1];
          goto LAB_0014e874;
        }
        ppcVar42 = &(conn->host).name;
        lVar52 = 0xa8;
        goto LAB_0014e8b6;
      }
LAB_0014f5d7:
      pXVar30 = X509_get_issuer_name((X509 *)psVar2->server_cert);
      iVar13 = x509_name_oneline((X509_NAME *)pXVar30,error_buffer_1,size_02);
      if (iVar13 == 0) {
        Curl_infof(data," issuer: %s",error_buffer_1);
        cVar9 = (byte)local_a80;
        if ((conn->http_proxy).proxytype != CURLPROXY_HTTPS) {
          pcVar38 = (data->set).ssl.issuercert;
          pcVar46 = (data->set).ssl.issuercert_blob;
joined_r0x0014f6c2:
          if (pcVar38 == (char *)0x0) goto LAB_0014f842;
LAB_0014f6c8:
          if (pcVar46 != (curl_blob *)0x0) goto LAB_0014f84b;
          pBVar26 = BIO_s_file();
          pBVar27 = BIO_new(pBVar26);
          if (pBVar27 == (BIO *)0x0) {
            uVar37 = ERR_get_error();
            ossl_strerror(uVar37,error_buffer,size_03);
            Curl_failf(data,"BIO_new return NULL, OpenSSL error %s",error_buffer);
            X509_free((X509 *)psVar2->server_cert);
            psVar2->server_cert = (X509 *)0x0;
            return CURLE_OUT_OF_MEMORY;
          }
          if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar52 = 0x6f0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar52 = 0x620;
          }
          lVar52 = BIO_ctrl(pBVar27,0x6c,3,*(void **)((long)&data->magic + lVar52));
          if ((int)lVar52 < 1) {
            if (cVar9 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar52 = 0x6f0,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar52 = 0x620;
              }
              Curl_failf(data,"SSL: Unable to open issuer cert (%s)",
                         *(undefined8 *)((long)&data->magic + lVar52));
            }
            BIO_free(pBVar27);
            goto LAB_0014f937;
          }
LAB_0014f859:
          pXVar29 = PEM_read_bio_X509(pBVar27,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
          if (pXVar29 == (X509 *)0x0) {
            if (cVar9 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar52 = 0x6f0,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar52 = 0x620;
              }
              Curl_failf(data,"SSL: Unable to read issuer cert (%s)",
                         *(undefined8 *)((long)&data->magic + lVar52));
            }
            BIO_free(pBVar27);
            pXVar29 = (X509 *)0x0;
          }
          else {
            iVar13 = X509_check_issued(pXVar29,(X509 *)psVar2->server_cert);
            if (iVar13 == 0) {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar52 = 0x6f0,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar52 = 0x620;
              }
              Curl_infof(data," SSL certificate issuer check ok (%s)",
                         *(undefined8 *)((long)&data->magic + lVar52));
              BIO_free(pBVar27);
              X509_free(pXVar29);
              goto LAB_0014fb4e;
            }
            if (cVar9 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar52 = 0x6f0,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar52 = 0x620;
              }
              Curl_failf(data,"SSL: Certificate issuer check failed (%s)",
                         *(undefined8 *)((long)&data->magic + lVar52));
            }
            BIO_free(pBVar27);
          }
          X509_free(pXVar29);
LAB_0014f937:
          X509_free((X509 *)psVar2->server_cert);
          psVar2->server_cert = (X509 *)0x0;
          return CURLE_SSL_ISSUER_ERROR;
        }
        if (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete) {
          pcVar38 = (data->set).proxy_ssl.issuercert;
          pcVar46 = (data->set).proxy_ssl.issuercert_blob;
          goto joined_r0x0014f6c2;
        }
        pcVar46 = (data->set).ssl.issuercert_blob;
        if ((data->set).ssl.issuercert != (char *)0x0) goto LAB_0014f6c8;
LAB_0014f842:
        if (pcVar46 != (curl_blob *)0x0) {
LAB_0014f84b:
          pBVar27 = BIO_new_mem_buf(pcVar46->data,(int)pcVar46->len);
          goto LAB_0014f859;
        }
LAB_0014fb4e:
        lVar52 = SSL_get_verify_result((SSL *)psVar2->handle);
        if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
          if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
            (data->set).ssl.certverifyresult = lVar52;
            goto joined_r0x0014fba9;
          }
          (data->set).proxy_ssl.certverifyresult = lVar52;
          if (lVar52 != 0) {
            bVar11 = (conn->proxy_ssl_config).field_0x68;
            goto joined_r0x0014fd74;
          }
        }
        else {
          (data->set).ssl.certverifyresult = lVar52;
joined_r0x0014fba9:
          if (lVar52 != 0) {
            bVar11 = (conn->ssl_config).field_0x68;
joined_r0x0014fd74:
            if ((bVar11 & 1) == 0) {
              pcVar38 = X509_verify_cert_error_string(lVar52);
              CVar14 = CURLE_OK;
              Curl_infof(data," SSL certificate verify result: %s (%ld), continuing anyway.",pcVar38
                         ,lVar52);
            }
            else {
              CVar14 = CURLE_PEER_FAILED_VERIFICATION;
              if ((byte)local_a80 != '\0') {
                pcVar38 = X509_verify_cert_error_string(lVar52);
                Curl_failf(data,"SSL certificate verify result: %s (%ld)",pcVar38,lVar52);
              }
            }
            goto LAB_0014f612;
          }
        }
        CVar14 = CURLE_OK;
        Curl_infof(data," SSL certificate verify ok.");
      }
      else {
        CVar14 = CURLE_PEER_FAILED_VERIFICATION;
        if ((byte)local_a80 != '\0') {
          Curl_failf(data,"SSL: couldn\'t get X509-issuer name!");
        }
      }
LAB_0014f612:
      cVar19 = (conn->http_proxy).proxytype;
      if ((cVar19 == CURLPROXY_HTTPS) &&
         (iVar13 = conn->sock[1], conn->proxy_ssl[iVar13 != -1].state != ssl_connection_complete)) {
        if (((conn->proxy_ssl_config).field_0x68 & 4) != 0) {
LAB_0014f7a4:
          psVar3 = psVar60->backend;
          lVar52 = SSL_ctrl((SSL *)psVar3->handle,0x46,0,&params);
          if (params.cert_id == (char *)0x0) {
            pcVar38 = "No OCSP response received";
LAB_0014f953:
            resp = (OCSP_RESPONSE *)0x0;
            Curl_failf(data,pcVar38);
LAB_0014f960:
            CVar14 = CURLE_SSL_INVALIDCERTSTATUS;
          }
          else {
            addr.__in6_u._0_8_ = params.cert_id;
            resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)&addr,lVar52);
            if (resp == (OCSP_RESPONSE *)0x0) {
              pcVar38 = "Invalid OCSP response";
              goto LAB_0014f953;
            }
            uVar17 = OCSP_response_status(resp);
            if (uVar17 != 0) {
              pcVar38 = OCSP_response_status_str((long)(int)uVar17);
              Curl_failf(data,"Invalid OCSP response status: %s (%d)",pcVar38,(ulong)uVar17);
              goto LAB_0014f960;
            }
            bs = OCSP_response_get1_basic(resp);
            if (bs == (OCSP_BASICRESP *)0x0) {
              Curl_failf(data,"Invalid OCSP response");
              CVar14 = CURLE_SSL_INVALIDCERTSTATUS;
              psVar60 = local_a90;
            }
            else {
              psVar28 = SSL_get_peer_cert_chain((SSL *)psVar3->handle);
              pXVar47 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
              iVar13 = OCSP_basic_verify(bs,psVar28,pXVar47,0);
              if (iVar13 < 1) {
                pcVar38 = "OCSP response verification failed";
LAB_001506d7:
                Curl_failf(data,pcVar38);
LAB_001506e6:
                CVar14 = CURLE_SSL_INVALIDCERTSTATUS;
              }
              else {
                pXVar29 = (X509 *)SSL_get1_peer_certificate(psVar3->handle);
                if (pXVar29 == (X509 *)0x0) {
                  pcVar38 = "Error getting peer certificate";
                  goto LAB_001506d7;
                }
                iVar13 = 0;
                do {
                  iVar15 = OPENSSL_sk_num(psVar28);
                  if (iVar15 <= iVar13) {
                    id = (OCSP_CERTID *)0x0;
                    goto LAB_00150031;
                  }
                  pXVar48 = (X509 *)OPENSSL_sk_value(psVar28,iVar13);
                  iVar15 = X509_check_issued(pXVar48,pXVar29);
                  iVar13 = iVar13 + 1;
                } while (iVar15 != 0);
                dgst = EVP_sha1();
                id = OCSP_cert_to_id(dgst,pXVar29,pXVar48);
LAB_00150031:
                X509_free(pXVar29);
                if (id == (OCSP_CERTID *)0x0) {
                  pcVar38 = "Error computing OCSP ID";
                  goto LAB_001506d7;
                }
                iVar13 = OCSP_resp_find_status
                                   (bs,id,(int *)&pubkeyoid,&crl_reason,
                                    (ASN1_GENERALIZEDTIME **)&x509,(ASN1_GENERALIZEDTIME **)&psig,
                                    (ASN1_GENERALIZEDTIME **)&ssl_sessionid);
                OCSP_CERTID_free(id);
                if (iVar13 != 1) {
                  pcVar38 = "Could not find certificate ID in OCSP response";
                  goto LAB_001506d7;
                }
                iVar13 = OCSP_check_validity((ASN1_GENERALIZEDTIME *)psig,
                                             (ASN1_GENERALIZEDTIME *)ssl_sessionid,300,-1);
                if (iVar13 == 0) {
                  pcVar38 = "OCSP response has expired";
                  goto LAB_001506d7;
                }
                pcVar38 = OCSP_cert_status_str((long)(int)(CURLcode)pubkeyoid);
                Curl_infof(data,"SSL certificate status: %s (%d)",pcVar38,
                           (ulong)pubkeyoid & 0xffffffff);
                CVar14 = (CURLcode)pubkeyoid;
                if ((CURLcode)pubkeyoid != CURLE_OK) {
                  if ((CURLcode)pubkeyoid != CURLE_UNSUPPORTED_PROTOCOL) {
                    CVar14 = CURLE_SSL_INVALIDCERTSTATUS;
                    goto LAB_001506e9;
                  }
                  pcVar38 = OCSP_crl_reason_str((long)crl_reason);
                  Curl_failf(data,"SSL certificate revocation reason: %s (%d)",pcVar38,
                             (ulong)(uint)crl_reason);
                  goto LAB_001506e6;
                }
              }
LAB_001506e9:
              OCSP_BASICRESP_free(bs);
              psVar60 = local_a90;
            }
          }
          OCSP_RESPONSE_free(resp);
          if (CVar14 != CURLE_OK) {
            X509_free((X509 *)psVar2->server_cert);
            psVar2->server_cert = (X509 *)0x0;
            return CVar14;
          }
          cVar19 = (conn->http_proxy).proxytype;
          CVar14 = CURLE_OK;
          goto LAB_0014f99a;
        }
        CVar21 = CURLE_OK;
        if ((byte)local_a80 != '\0') {
          CVar21 = CVar14;
        }
LAB_0014f9b9:
        lVar52 = (ulong)(conn->proxy_ssl[iVar13 != -1].state != ssl_connection_complete) * 8 + 0x8b0
        ;
      }
      else {
        if (((conn->ssl_config).field_0x68 & 4) != 0) goto LAB_0014f7a4;
LAB_0014f99a:
        CVar21 = CURLE_OK;
        if ((byte)local_a80 != '\0') {
          CVar21 = CVar14;
        }
        lVar52 = 0x8b0;
        if (cVar19 == CURLPROXY_HTTPS) {
          iVar13 = conn->sock[1];
          goto LAB_0014f9b9;
        }
      }
      pcVar38 = *(char **)((long)&data->magic + lVar52);
      local_9c0 = pcVar38;
      if ((CVar21 == CURLE_OK) && (pcVar38 != (char *)0x0)) {
        pXVar40 = psVar2->server_cert;
        if (pXVar40 == (X509 *)0x0) {
LAB_0014faa5:
          CVar21 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
        }
        else {
          pXVar34 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar40);
          uVar17 = i2d_X509_PUBKEY(pXVar34,(uchar **)0x0);
          if ((int)uVar17 < 1) goto LAB_0014faa5;
          uVar37 = (ulong)uVar17;
          pubkey = (uchar *)(*Curl_cmalloc)(uVar37);
          params.cert_id = (char *)pubkey;
          if (pubkey == (uchar *)0x0) goto LAB_0014faa5;
          pXVar34 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar40);
          uVar20 = i2d_X509_PUBKEY(pXVar34,(uchar **)&params);
          if ((params.cert_id == (char *)0x0 || uVar17 != uVar20) ||
              (long)params.cert_id - (long)pubkey != uVar37) {
            CVar21 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          }
          else {
            CVar21 = Curl_pin_peer_pubkey(data,pcVar38,pubkey,uVar37);
          }
          (*Curl_cfree)(pubkey);
          if (CVar21 == CURLE_OK) {
            CVar21 = CURLE_OK;
            psVar60 = local_a90;
            goto LAB_0014fac9;
          }
        }
        psVar60 = local_a90;
        Curl_failf(data,"SSL: public key does not match pinned public key!");
      }
LAB_0014fac9:
      X509_free((X509 *)psVar2->server_cert);
      psVar2->server_cert = (X509 *)0x0;
      psVar60->connecting_state = ssl_connect_done;
      if (CVar21 != CURLE_OK) {
        return CVar21;
      }
    }
  }
  else if (sVar61 != ssl_connect_done) {
    _Var12 = false;
    goto LAB_0014da5e;
  }
  psVar60->state = ssl_connection_complete;
  conn->recv[local_9d8] = ossl_recv;
  conn->send[local_9d8] = ossl_send;
  _Var12 = true;
  local_a90 = psVar60;
LAB_0014da5e:
  *local_9e0 = _Var12;
  local_a90->connecting_state = ssl_connect_1;
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct Curl_easy *data,
                                    struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(data, conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(data, conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(data, conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}